

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DPIFaultObject.cpp
# Opt level: O3

void __thiscall
eipScanner::vendor::ra::powerFlex525::DPIFaultObject::DPIFaultObject
          (DPIFaultObject *this,CipUint instanceId,SPtr *si)

{
  undefined1 local_31;
  SPtr local_30;
  
  local_30.super___shared_ptr<eipScanner::MessageRouter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<eipScanner::MessageRouter,std::allocator<eipScanner::MessageRouter>>
            (&local_30.super___shared_ptr<eipScanner::MessageRouter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(MessageRouter **)&local_30,
             (allocator<eipScanner::MessageRouter> *)&local_31);
  DPIFaultObject(this,instanceId,si,&local_30);
  if (local_30.super___shared_ptr<eipScanner::MessageRouter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<eipScanner::MessageRouter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

DPIFaultObject::DPIFaultObject(CipUint instanceId, const SessionInfoIf::SPtr &si)
            : DPIFaultObject(instanceId, si, std::make_shared<MessageRouter>()) {

    }